

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_parameter.hpp
# Opt level: O3

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,
                mrg_parameter<int,_2,_trng::yarn2> *P)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  mrg_parameter<int,_2,_trng::yarn2> P_new;
  delim_c local_2b;
  delim_c local_2a;
  delim_c local_29;
  mrg_parameter<int,_2,_trng::yarn2> local_28;
  
  local_28.a[0] = 0;
  local_28.a[1] = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_29.c = '(';
  utility::operator>>(in,&local_29);
  std::wistream::operator>>((wistream *)in,local_28.a);
  local_2a.c = ' ';
  utility::operator>>(in,&local_2a);
  std::wistream::operator>>((wistream *)in,local_28.a + 1);
  local_2b.c = ')';
  utility::operator>>(in,&local_2b);
  lVar2 = *(long *)in;
  lVar3 = *(long *)(lVar2 + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    *(mrg_parameter<int,_2,_trng::yarn2> *)P->a = local_28;
    lVar3 = *(long *)(lVar2 + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg_parameter &P) {
      mrg_parameter P_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::delim('(');
      for (int i{0}; i < n; ++i) {
        in >> P_new.a[i];
        if (i + 1 < n)
          in >> utility::delim(' ');
      }
      in >> utility::delim(')');
      if (in)
        P = P_new;
      in.flags(flags);
      return in;
    }